

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion *
AML::quatKinematicRates_BodyRates
          (Quaternion *__return_storage_ptr__,Quaternion *quat,Vector3 *bodyRates)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double q3;
  double q2;
  double q1;
  double q0;
  double r;
  double q;
  double p;
  Vector3 *bodyRates_local;
  Quaternion *quat_local;
  
  dVar1 = (bodyRates->field_0).data[0];
  dVar2 = (bodyRates->field_0).data[1];
  dVar3 = (bodyRates->field_0).data[2];
  Quaternion::Quaternion
            (__return_storage_ptr__,
             (-(quat->field_0).data[3] * dVar3 +
             -(quat->field_0).data[1] * dVar1 + -((quat->field_0).data[2] * dVar2)) * 0.5,
             (-(quat->field_0).data[2] * dVar3 +
             (quat->field_0).data[0] * dVar1 + (quat->field_0).data[3] * dVar2) * 0.5,
             ((quat->field_0).data[1] * dVar3 +
             -(quat->field_0).data[3] * dVar1 + (quat->field_0).data[0] * dVar2) * 0.5,
             ((quat->field_0).data[0] * dVar3 +
             (quat->field_0).data[2] * dVar1 + -((quat->field_0).data[1] * dVar2)) * 0.5);
  return __return_storage_ptr__;
}

Assistant:

Quaternion quatKinematicRates_BodyRates(const Quaternion& quat, const Vector3& bodyRates)
    {
        const double p = bodyRates.x;
        const double q = bodyRates.y;
        const double r = bodyRates.z;
        const double q0 = 0.5 * (-quat.q1 * p - quat.q2 * q - quat.q3 * r);
        const double q1 = 0.5 * (quat.q0 * p + quat.q3 * q - quat.q2 * r);
        const double q2 = 0.5 * (-quat.q3 * p + quat.q0 * q + quat.q1 * r);
        const double q3 = 0.5 * (quat.q2 * p - quat.q1 * q + quat.q0 * r);
        return Quaternion(q0, q1, q2, q3);
    }